

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmCas<(moira::Instr)143,(moira::Mode)4,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  char cVar5;
  uint uVar6;
  long lVar7;
  Ea<(moira::Mode)4,_1> dst;
  u32 local_44;
  ushort local_40;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar6 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  if (((uVar6 & 0xfe38) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)143,(moira::Mode)4,1>(this,str,addr,op);
    return;
  }
  cVar5 = 'c';
  lVar7 = 1;
  do {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = cVar5;
    cVar5 = "cas"[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (str->style->syntax - MOIRA_MIT < 3) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = 'b';
  }
  else {
    cVar5 = '.';
    lVar7 = 0;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = ".b"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 2);
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = ' ';
    } while (str->ptr < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(uVar6 & 7));
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Dn)((uVar6 & 0xffff) >> 6 & 7));
  pcVar4 = str->ptr;
  str->ptr = pcVar4 + 1;
  *pcVar4 = ',';
  SVar3 = str->style->syntax;
  if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
    pcVar4 = str->ptr;
    str->ptr = pcVar4 + 1;
    *pcVar4 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)4,_1> *)&local_44);
  if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
    cVar5 = ';';
    lVar7 = 1;
    do {
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar5;
      cVar5 = "trap%-2s  ; (2+)"[lVar7 + 10];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 7);
  }
  return;
}

Assistant:

void
Moira::dasmCas(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto dc  = Dn ( _____________xxx(ext) );
    auto du  = Dn ( _______xxx______(ext) );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExt(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << dc << Sep{} << du << Sep{} << dst;
    str << Av<I, M, S>{};
}